

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateExport.cpp
# Opt level: O2

void helicsFederateLocalError(HelicsFederate fed,int errorCode,char *errorString,HelicsError *err)

{
  Federate *this;
  string_view message;
  allocator<char> local_41;
  char *local_40;
  size_t local_38;
  
  this = getFed(fed,err);
  if (this != (Federate *)0x0) {
    if (errorString == (char *)0x0) {
      std::__cxx11::string::string((string *)&local_40,&gHelicsEmptyStr_abi_cxx11_);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,errorString,&local_41);
    }
    message._M_str = local_40;
    message._M_len = local_38;
    helics::Federate::localError(this,errorCode,message);
    std::__cxx11::string::~string((string *)&local_40);
  }
  return;
}

Assistant:

void helicsFederateLocalError(HelicsFederate fed, int errorCode, const char* errorString, HelicsError* err)
{
    auto* fedObj = getFed(fed, err);
    if (fedObj == nullptr) {
        return;
    }
    try {
        fedObj->localError(errorCode, AS_STRING(errorString));
    }
    // LCOV_EXCL_START
    catch (...) {
        helicsErrorHandler(err);
    }
    // LCOV_EXCL_STOP
}